

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac.c
# Opt level: O3

_Bool duckdb_je_pac_decay_ms_set
                (tsdn_t *tsdn,pac_t *pac,extent_state_t state,ssize_t decay_ms,
                pac_purge_eagerness_t eagerness)

{
  pthread_mutex_t *__mutex;
  uint64_t *puVar1;
  witness_t **ppwVar2;
  pac_stats_t *ppVar3;
  _Bool _Var4;
  int iVar5;
  ecache_t *ecache;
  long lVar6;
  mutex_prof_data_t *data;
  decay_t *decay;
  nstime_t cur_time;
  nstime_t local_38;
  
  lVar6 = 0;
  decay = &pac->decay_muzzy;
  if (state == extent_state_dirty) {
    decay = &pac->decay_dirty;
  }
  ecache = &pac->ecache_dirty;
  if (state != extent_state_dirty) {
    ecache = &pac->ecache_muzzy;
    lVar6 = 0x18;
  }
  ppVar3 = pac->stats;
  _Var4 = duckdb_je_decay_ms_valid(decay_ms);
  if (_Var4) {
    __mutex = (pthread_mutex_t *)((long)&(decay->mtx).field_0 + 0x48);
    iVar5 = pthread_mutex_trylock(__mutex);
    if (iVar5 != 0) {
      duckdb_je_malloc_mutex_lock_slow(&decay->mtx);
      (decay->mtx).field_0.field_0.locked.repr = true;
    }
    puVar1 = &(decay->mtx).field_0.field_0.prof_data.n_lock_ops;
    *puVar1 = *puVar1 + 1;
    if ((decay->mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
      (decay->mtx).field_0.field_0.prof_data.prev_owner = tsdn;
      ppwVar2 = &(decay->mtx).field_0.witness.link.qre_prev;
      *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
    }
    duckdb_je_nstime_init_update(&local_38);
    duckdb_je_decay_reinit(decay,&local_38,decay_ms);
    duckdb_je_pac_maybe_decay_purge
              (tsdn,pac,decay,
               (pac_decay_stats_t *)((long)&(ppVar3->decay_dirty).npurge.val.repr + lVar6),ecache,
               eagerness);
    (decay->mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock(__mutex);
  }
  return !_Var4;
}

Assistant:

bool
pac_decay_ms_set(tsdn_t *tsdn, pac_t *pac, extent_state_t state,
    ssize_t decay_ms, pac_purge_eagerness_t eagerness) {
	decay_t *decay;
	pac_decay_stats_t *decay_stats;
	ecache_t *ecache;
	pac_decay_data_get(pac, state, &decay, &decay_stats, &ecache);

	if (!decay_ms_valid(decay_ms)) {
		return true;
	}

	malloc_mutex_lock(tsdn, &decay->mtx);
	/*
	 * Restart decay backlog from scratch, which may cause many dirty pages
	 * to be immediately purged.  It would conceptually be possible to map
	 * the old backlog onto the new backlog, but there is no justification
	 * for such complexity since decay_ms changes are intended to be
	 * infrequent, either between the {-1, 0, >0} states, or a one-time
	 * arbitrary change during initial arena configuration.
	 */
	nstime_t cur_time;
	nstime_init_update(&cur_time);
	decay_reinit(decay, &cur_time, decay_ms);
	pac_maybe_decay_purge(tsdn, pac, decay, decay_stats, ecache, eagerness);
	malloc_mutex_unlock(tsdn, &decay->mtx);

	return false;
}